

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

bool __thiscall
icu_63::number::impl::NumberStringBuilder::contentEquals
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ValueOrHeapArray<UNumberFormatFields> *pVVar4;
  long lVar5;
  ValueOrHeapArray<char16_t> *pVVar6;
  ValueOrHeapArray<char16_t> *pVVar7;
  ulong uVar8;
  ValueOrHeapArray<UNumberFormatFields> *pVVar9;
  long lVar10;
  bool bVar11;
  bool bVar12;
  
  uVar3 = this->fLength;
  if (uVar3 == other->fLength) {
    bVar11 = (int)uVar3 < 1;
    if (0 < (int)uVar3) {
      bVar12 = this->fUsingHeap != false;
      pVVar6 = &this->fChars;
      if (bVar12) {
        pVVar6 = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      }
      pVVar4 = &this->fFields;
      if (bVar12) {
        pVVar4 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      bVar12 = other->fUsingHeap != false;
      lVar5 = (long)this->fZero;
      pVVar7 = &other->fChars;
      if (bVar12) {
        pVVar7 = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
      }
      pVVar9 = &other->fFields;
      if (bVar12) {
        pVVar9 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
      }
      lVar10 = (long)other->fZero;
      if (pVVar6->value[lVar5] == pVVar7->value[lVar10]) {
        uVar8 = 1;
        do {
          if (*(int *)((long)pVVar4 + uVar8 * 4 + lVar5 * 4 + -4) !=
              *(int *)((long)pVVar9 + uVar8 * 4 + lVar10 * 4 + -4)) {
            return bVar11;
          }
          bVar11 = uVar3 <= uVar8;
          if (uVar8 == uVar3) {
            return bVar11;
          }
          lVar1 = uVar8 * 2;
          lVar2 = uVar8 * 2;
          uVar8 = uVar8 + 1;
        } while (*(short *)((long)pVVar6 + lVar1 + lVar5 * 2) ==
                 *(short *)((long)pVVar7 + lVar2 + lVar10 * 2));
      }
    }
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool NumberStringBuilder::contentEquals(const NumberStringBuilder &other) const {
    if (fLength != other.fLength) {
        return false;
    }
    for (int32_t i = 0; i < fLength; i++) {
        if (charAt(i) != other.charAt(i) || fieldAt(i) != other.fieldAt(i)) {
            return false;
        }
    }
    return true;
}